

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_k_tf.c
# Opt level: O1

void lda_k_tf_init(xc_func_type *p)

{
  double dVar1;
  uint uVar2;
  double *pdVar3;
  long lVar4;
  undefined8 *puVar5;
  long lVar6;
  long *plVar7;
  long lVar8;
  long extraout_RDX;
  long in_RSI;
  long *plVar9;
  long lVar10;
  undefined8 uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  plVar9 = (long *)0x8;
  puVar5 = (undefined8 *)malloc(8);
  p->params = puVar5;
  uVar2 = p->info->number;
  plVar7 = (long *)(ulong)uVar2;
  if (uVar2 == 0x32) {
    uVar11 = 0x3ff1ade0a4f67432;
  }
  else {
    if (uVar2 != 0x33) {
      lda_k_tf_init_cold_1();
      if (in_RSI != 0) {
        lVar4 = plVar9[1];
        lVar10 = 0;
        do {
          if ((int)lVar4 == 2) {
            lVar6 = (int)plVar9[9] * lVar10;
            dVar12 = *(double *)(extraout_RDX + lVar6 * 8) +
                     *(double *)(extraout_RDX + 8 + lVar6 * 8);
          }
          else {
            dVar12 = *(double *)(extraout_RDX + (int)plVar9[9] * lVar10 * 8);
          }
          dVar1 = (double)plVar9[0x30];
          if (dVar1 <= dVar12) {
            dVar12 = *(double *)(extraout_RDX + (int)plVar9[9] * lVar10 * 8);
            pdVar3 = (double *)plVar9[0x2f];
            dVar14 = (double)plVar9[0x31];
            dVar13 = 1.0;
            if (1.0 <= dVar14) {
              dVar13 = cbrt(dVar14);
              dVar13 = dVar13 * dVar13 * dVar14;
            }
            if (dVar12 <= dVar1) {
              dVar12 = dVar1;
            }
            dVar1 = *pdVar3;
            dVar14 = cbrt(0.3183098861837907);
            dVar12 = cbrt(dVar12);
            lVar6 = *plVar7;
            if ((lVar6 != 0) && ((*(byte *)(*plVar9 + 0x40) & 1) != 0)) {
              lVar8 = (int)plVar9[0xb] * lVar10;
              *(double *)(lVar6 + lVar8 * 8) =
                   (dVar12 * dVar12 *
                   (1.0 / (dVar14 * dVar14)) * 2.519842099789747 *
                   dVar13 * dVar1 * 1.4422495703074083) / 3.0 + *(double *)(lVar6 + lVar8 * 8);
            }
          }
          lVar10 = lVar10 + 1;
        } while (in_RSI != lVar10);
      }
      return;
    }
    uVar11 = 0x3ff247624737528c;
  }
  *puVar5 = uVar11;
  return;
}

Assistant:

static void
lda_k_tf_init(xc_func_type *p)
{
  lda_k_tf_params *params;

  assert(p!=NULL && p->params == NULL);
  p->params = libxc_malloc(sizeof(lda_k_tf_params));
  params = (lda_k_tf_params *) (p->params);

  switch(p->info->number){
  case XC_LDA_K_TF:
    /* 3/10*(3*M_PI^2)^(2/3) * (3/4 pi)^(2/3) = 3/10*pow(9*M_PI/4, 2/3) */
    params->ax = 1.104950565705860002098832079519635692942;
    break;
  case XC_LDA_K_LP:
    /* 3*M_PI/2^(5/3) * (3/4 pi)^(2/3) = 3*M_PI*pow(3/(8*M_PI), 2/3)*/
    params->ax = 1.142427709758666675644309251677891925671;
    break;
  default:
    fprintf(stderr, "Internal error in lda_k_tf\n");
    exit(1);
  }
}